

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_CBZ(DisasContext_conflict1 *s,arg_CBZ *a)

{
  int reg;
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  TCGTemp *pTVar1;
  TCGLabel *l;
  uintptr_t o;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  reg = a->rn;
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar1 - (long)s_00);
  load_reg_var(s,var,reg);
  if (s->condjmp == 0) {
    l = gen_new_label_aarch64(s->uc->tcg_ctx);
    s->condlabel = l;
    s->condjmp = 1;
  }
  else {
    l = s->condlabel;
  }
  tcg_gen_brcondi_i32_aarch64(s_00,(a->nz == 0) + TCG_COND_EQ,var,0,l);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
  if (((s->base).singlestep_enabled == false) && (s->ss_active != true)) {
    gen_goto_tb(s,0,(ulong)(a->imm + (uint)(s->thumb == 0) * 4 + (int)s->pc_curr + 4));
    return (_Bool)extraout_AL;
  }
  trans_CBZ_cold_1();
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool trans_CBZ(DisasContext *s, arg_CBZ *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp = load_reg(s, a->rn);

    arm_gen_condlabel(s);
    tcg_gen_brcondi_i32(tcg_ctx, a->nz ? TCG_COND_EQ : TCG_COND_NE,
                        tmp, 0, s->condlabel);
    tcg_temp_free_i32(tcg_ctx, tmp);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}